

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

void glfwGetCursorPos(GLFWwindow *handle,double *xpos,double *ypos)

{
  _GLFWwindow *window;
  int iStack_3c;
  int iStack_38;
  undefined1 auStack_34 [4];
  undefined1 auStack_30 [4];
  undefined1 auStack_2c [4];
  undefined1 auStack_28 [8];
  undefined1 auStack_20 [8];
  
  if (xpos != (double *)0x0) {
    *xpos = 0.0;
  }
  if (ypos != (double *)0x0) {
    *ypos = 0.0;
  }
  if (_glfwInitialized != '\0') {
    if (*(int *)(handle + 0x58) == 0x34003) {
      if (xpos != (double *)0x0) {
        *xpos = *(double *)(handle + 0x48);
      }
      if (ypos != (double *)0x0) {
        *ypos = *(double *)(handle + 0x50);
      }
      return;
    }
    XQueryPointer(_glfw.x11.display,*(undefined8 *)(handle + 0x270),auStack_20,auStack_28,auStack_2c
                  ,auStack_30,&iStack_38,&iStack_3c,auStack_34);
    if (xpos != (double *)0x0) {
      *xpos = (double)iStack_38;
    }
    if (ypos != (double *)0x0) {
      *ypos = (double)iStack_3c;
    }
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwGetCursorPos(GLFWwindow* handle, double* xpos, double* ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;

    _GLFW_REQUIRE_INIT();

    if (window->cursorMode == GLFW_CURSOR_DISABLED)
    {
        if (xpos)
            *xpos = window->cursorPosX;
        if (ypos)
            *ypos = window->cursorPosY;
    }
    else
        _glfwPlatformGetCursorPos(window, xpos, ypos);
}